

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusmenubar.cpp
# Opt level: O3

void QDBusMenuBar::updateMenuItem(QDBusPlatformMenuItem *item,QPlatformMenu *menu)

{
  undefined1 uVar1;
  long *plVar2;
  long in_FS_OFFSET;
  QIcon local_40;
  long local_38;
  long local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  plVar2 = (long *)QMetaObject::cast((QObject *)&QDBusPlatformMenu::staticMetaObject);
  local_40.d = (QIconPrivate *)plVar2[3];
  local_38 = plVar2[4];
  local_30 = plVar2[5];
  if (local_40.d != (QIconPrivate *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)&(local_40.d)->engine)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)&(local_40.d)->engine)->_q_value).super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  (**(code **)(*(long *)&item->super_QPlatformMenuItem + 0x70))(item,&local_40);
  if (local_40.d != (QIconPrivate *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)&(local_40.d)->engine)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)&(local_40.d)->engine)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)&(local_40.d)->engine)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_40.d,2,0x10);
    }
  }
  QIcon::QIcon(&local_40,(QIcon *)(plVar2 + 6));
  (**(code **)(*(long *)&item->super_QPlatformMenuItem + 0x78))(item,&local_40);
  QIcon::~QIcon(&local_40);
  uVar1 = (**(code **)(*plVar2 + 0xa8))(plVar2);
  (**(code **)(*(long *)&item->super_QPlatformMenuItem + 0xc0))(item,uVar1);
  (**(code **)(*(long *)&item->super_QPlatformMenuItem + 0x88))
            (item,*(undefined1 *)((long)plVar2 + 0x39));
  (**(code **)(*(long *)&item->super_QPlatformMenuItem + 0x80))(item,menu);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDBusMenuBar::updateMenuItem(QDBusPlatformMenuItem *item, QPlatformMenu *menu)
{
    const QDBusPlatformMenu *ourMenu = qobject_cast<const QDBusPlatformMenu *>(menu);
    item->setText(ourMenu->text());
    item->setIcon(ourMenu->icon());
    item->setEnabled(ourMenu->isEnabled());
    item->setVisible(ourMenu->isVisible());
    item->setMenu(menu);
}